

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O3

int get_network_err(void)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  if (((0xb < uVar1) || (uVar2 = 0, (0x811U >> (uVar1 & 0x1f) & 1) == 0)) &&
     (uVar2 = 0, uVar1 != 0x73)) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

int get_network_err()
{
#if defined(__linux__) || defined(__APPLE__)
    int error = errno;
    if (error == 0 || error == EINTR || error == EAGAIN || error == EINPROGRESS)
    {
        return 0;
    }
#else
    int error = WSAGetLastError();
    if (error == 0 || error == WSAEINTR || error == WSAEWOULDBLOCK || error == WSAEINPROGRESS)
    {
        return 0;
    }
#endif
    return error;
}